

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall
Alg::opimb_fast_end(Alg *this,Graph *graph,double budget,
                   vector<double,_std::allocator<double>_> *budget_list,double epsilon,double feps,
                   double delta,string *model,string *graphname,int mode)

{
  uint uVar1;
  TResult *pTVar2;
  ResultInfo *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  string *__rhs;
  int iVar10;
  ostream *poVar11;
  ulong uVar12;
  char *__rhs_00;
  undefined8 *puVar13;
  byte bVar14;
  Graph *graph_00;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double local_508;
  double local_4d8;
  double local_4c0;
  double timeb;
  undefined1 local_468 [16];
  string *local_458;
  string *local_450;
  long local_448;
  double local_440;
  double local_438;
  double local_430;
  HyperGraph *local_428;
  double local_420;
  double local_418;
  double local_410;
  Timer local_408;
  _Vector_base<double,_std::allocator<double>_> local_3e8;
  _Vector_base<double,_std::allocator<double>_> local_3d0;
  string local_3b8;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  time_t now;
  ofstream outfile;
  
  local_408.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_408.__processName = "OPIM-B-FAST-END";
  local_408.__LastTime.__d.__r = local_408.__StartTime.__d.__r;
  local_408.__EndTime.__d.__r = local_408.__StartTime.__d.__r;
  std::ofstream::ofstream(&outfile);
  if (ABS(feps + -0.01) <= 1e-06) {
    dVar17 = 0.437888;
  }
  else if (ABS(feps + -0.05) <= 1e-06) {
    dVar17 = 0.435641;
  }
  else if (ABS(feps + -0.1) <= 1e-06) {
    dVar17 = 0.432857;
  }
  else if (ABS(feps + -0.15) <= 1e-06) {
    dVar17 = 0.430099;
  }
  else {
    if (1e-06 < ABS(feps + -0.2)) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = "feps error!";
      __cxa_throw(puVar13,&char_const*::typeinfo,0);
    }
    dVar17 = 0.427369;
  }
  dVar17 = exp((1.0 - feps) * dVar17);
  std::operator<<((ostream *)&std::cout,"Approx: ");
  dVar17 = 1.0 - 1.0 / dVar17;
  poVar11 = std::ostream::_M_insert<double>(dVar17);
  std::endl<char,std::char_traits<char>>(poVar11);
  dVar3 = 6.0 / delta;
  dVar4 = log(dVar3);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_3d0,budget_list);
  iVar10 = cal_k_max((vector<double,_std::allocator<double>_> *)&local_3d0,budget);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_3d0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_3e8,budget_list);
  cal_k_min((vector<double,_std::allocator<double>_> *)&local_3e8,budget);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_3e8);
  dVar20 = (double)this->__numV;
  dVar18 = (double)iVar10;
  dVar19 = log(dVar20);
  dVar5 = log(dVar3);
  dVar19 = (dVar19 * dVar18 + dVar5) * dVar17;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  dVar19 = dVar19 + dVar4 * dVar17;
  dVar20 = ((dVar20 + dVar20) * dVar19 * dVar19) / (double)this->__numV;
  uVar12 = (ulong)dVar20;
  dVar4 = log((double)this->__numV);
  dVar3 = log(dVar3);
  dVar3 = (dVar4 * dVar18 + dVar3) * dVar17;
  local_458 = model;
  local_450 = graphname;
  if (dVar3 < 0.0) {
    sqrt(dVar3);
  }
  bVar14 = 0;
  dVar3 = log2(epsilon * epsilon * dVar18);
  local_448 = ((long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3) + 1;
  auVar23._8_4_ = (int)((ulong)local_448 >> 0x20);
  auVar23._0_8_ = local_448;
  auVar23._12_4_ = 0x45300000;
  dVar3 = (((auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_448) - 4503599627370496.0)) * 3.0) / delta;
  dVar4 = log(dVar3);
  dVar3 = log(dVar3);
  timeb = 0.0;
  local_428 = &this->__hyperG;
  local_430 = (dVar4 + dVar4) / 9.0;
  dVar19 = dVar4 * 0.5;
  dVar3 = dVar3 * 0.5;
  local_438 = SQRT(dVar19);
  local_440 = SQRT(dVar3);
  local_4d8 = 0.0;
  local_4c0 = 0.0;
  bVar7 = false;
  while( true ) {
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar11);
    graph_00 = (Graph *)(((long)(dVar20 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12) <<
                        (bVar14 & 0x3f));
    Timer::get_operation_time(&local_408);
    HyperGraph::build_n_RRsets(local_428,(size_t)graph_00);
    HyperGraph::build_n_RRsets(&this->__hyperGVldt,(size_t)graph_00);
    poVar11 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::endl<char,std::char_traits<char>>(poVar11);
    this->__numRRsets = (this->__hyperG).__numRRsets;
    local_410 = Timer::get_operation_time(&local_408);
    dVar5 = max_cover_lazy_budget_fast_end(this,graph_00,budget,budget_list,feps,&timeb,mode);
    local_418 = Timer::get_operation_time(&local_408);
    dVar18 = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
    dVar21 = (double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25;
    local_468._8_4_ = SUB84(dVar21,0);
    local_468._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0;
    local_468._12_4_ = (int)((ulong)dVar21 >> 0x20);
    dVar21 = dVar5 / dVar17;
    if ((mode == 2) || (dVar9 = dVar5, mode == 1)) {
      if (this->__is_inf_cost == true) {
        dVar9 = dVar21;
        if (this->__boundMin_inf_cost <= dVar21) {
          dVar9 = this->__boundMin_inf_cost;
        }
      }
      else {
        dVar9 = this->__boundMin_inf;
      }
    }
    uVar1 = this->__numV;
    std::operator<<((ostream *)&std::cout,"========upper bound ratio: ");
    poVar11 = std::ostream::_M_insert<double>(dVar9 / dVar21);
    poVar11 = std::operator<<(poVar11,"========");
    std::endl<char,std::char_traits<char>>(poVar11);
    dVar21 = (((double)local_468._8_8_ + (double)local_468._0_8_) * dVar18) / (double)uVar1 +
             local_430;
    auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)this->__numRRsets);
    auVar24._8_4_ = (int)(this->__numRRsets >> 0x20);
    auVar24._12_4_ = 0x45300000;
    uVar1 = this->__numV;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    local_468._0_8_ = dVar21;
    uVar15 = SUB84(local_438,0);
    uVar16 = (undefined4)((ulong)local_438 >> 0x20);
    if (dVar19 < 0.0) {
      dVar21 = sqrt(dVar19);
      uVar15 = SUB84(dVar21,0);
      uVar16 = (undefined4)((ulong)dVar21 >> 0x20);
    }
    local_420 = (double)CONCAT44(uVar16,uVar15);
    dVar21 = (((auVar24._8_8_ - 1.9342813113834067e+25) + (auVar24._0_8_ - 4503599627370496.0)) *
             dVar9) / (double)uVar1 + dVar3;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    local_508 = local_440;
    if (dVar3 < 0.0) {
      local_508 = sqrt(dVar3);
    }
    poVar11 = std::operator<<((ostream *)&std::cout," -->OPIM-B-FAST-END (");
    bVar14 = bVar14 + 1;
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    poVar11 = std::operator<<(poVar11,"/");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::operator<<(poVar11,") approx. (max-cover): ");
    dVar22 = ((double)local_468._0_8_ - local_420) * ((double)local_468._0_8_ - local_420) -
             dVar4 / 18.0;
    dVar6 = 0.0;
    if (0.0 <= dVar22) {
      dVar6 = dVar22;
    }
    dVar6 = dVar6 / ((dVar21 + local_508) * (dVar21 + local_508));
    poVar11 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar11," (");
    poVar11 = std::ostream::_M_insert<double>(dVar5 / dVar9);
    poVar11 = std::operator<<(poVar11,"), #RR sets: ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::operator<<(poVar11,'\n');
    local_4c0 = local_4c0 + local_410;
    local_4d8 = local_4d8 + local_418;
    if ((dVar17 - epsilon <= dVar6) && (bVar7)) break;
    bVar8 = bVar7;
    if (!bVar7) {
      bVar8 = true;
    }
    if (dVar17 - epsilon <= dVar6) {
      bVar7 = bVar8;
    }
  }
  pTVar2 = this->__tRes;
  pTVar2->__Approx = dVar6;
  dVar17 = Timer::get_total_time(&local_408);
  pTVar2->__RunningTime = dVar17;
  this_00 = this->__tRes;
  this_00->__Influence = dVar18;
  this_00->__InfluenceOriginal = dVar5;
  ResultInfo::set_seed_vec(this_00,&this->__vecSeed);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf,&this->__vecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->__tRes->__VecSeed_inf_cost,&this->__vecSeed_inf_cost);
  pTVar2 = this->__tRes;
  pTVar2->__BoundMin_inf = this->__boundMin_inf;
  pTVar2->__BoundMin_inf_cost = this->__boundMin_inf_cost;
  pTVar2->__RRsetsSize = this->__numRRsets * 2;
  std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
  poVar11 = std::ostream::_M_insert<double>(dVar18);
  std::operator<<(poVar11,", time: ");
  poVar11 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
  std::operator<<(poVar11,'\n');
  std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar11 = std::ostream::_M_insert<double>(local_4c0);
  std::operator<<(poVar11,", ");
  dVar17 = timeb;
  local_4d8 = local_4d8 - timeb;
  poVar11 = std::ostream::_M_insert<double>(local_4d8);
  std::operator<<(poVar11,'\n');
  std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
  poVar11 = std::ostream::_M_insert<double>(dVar17);
  std::operator<<(poVar11,'\n');
  poVar11 = std::operator<<((ostream *)&std::cout,"Seed size: ");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::endl<char,std::char_traits<char>>(poVar11);
  now = time((time_t *)0x0);
  __rhs_00 = ctime(&now);
  std::operator+(&local_378,"fast/",local_458);
  __rhs = local_450;
  std::operator+(&local_358,&local_378,"_");
  std::operator+(&local_338,&local_358,__rhs);
  std::operator+(&local_318,&local_338,"_");
  std::__cxx11::to_string(&local_398,epsilon);
  std::operator+(&local_2f8,&local_318,&local_398);
  std::operator+(&local_2d8,&local_2f8,"_");
  std::__cxx11::to_string(&local_3b8,feps);
  std::operator+(&local_2b8,&local_2d8,&local_3b8);
  std::operator+(&local_298,&local_2b8,"_");
  std::operator+(&local_278,&local_298,__rhs_00);
  std::operator+(&local_258,&local_278,".txt");
  std::ofstream::open((string *)&outfile,(_Ios_Openmode)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  poVar11 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
  poVar11 = std::operator<<(poVar11,",");
  poVar11 = std::operator<<(poVar11,",");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::operator<<(poVar11,",");
  poVar11 = std::ostream::_M_insert<double>(dVar18);
  poVar11 = std::operator<<(poVar11,",");
  std::operator<<(poVar11,",");
  poVar11 = std::ostream::_M_insert<double>(dVar5);
  poVar11 = std::operator<<(poVar11,",");
  poVar11 = std::operator<<(poVar11,",");
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::operator<<(poVar11,",");
  poVar11 = std::ostream::_M_insert<double>(dVar6);
  poVar11 = std::operator<<(poVar11,",");
  std::operator<<(poVar11,",");
  poVar11 = std::ostream::_M_insert<double>(local_4c0);
  std::operator<<(poVar11,",");
  poVar11 = std::ostream::_M_insert<double>(dVar17);
  std::operator<<(poVar11,",");
  std::ostream::_M_insert<double>(local_4d8);
  std::ofstream::~ofstream(&outfile);
  return 0.0;
}

Assistant:

double Alg::opimb_fast_end(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double feps, const double delta, const std::string model,
        std::string graphname, const int mode) {
    Timer timerOPIMC("OPIM-B-FAST-END");
    std::ofstream outfile;
    double e_alpha;
    if (fabs(feps - 0.01) <= 0.000001) {
        e_alpha = exp(0.437888 * (1 - feps));
    }
    else if (fabs(feps - 0.05) <= 0.000001) {
        e_alpha = exp(0.435641 * (1 - feps));
    }
    else if (fabs(feps - 0.1) <= 0.000001) {
        e_alpha = exp(0.432857 * (1 - feps));
    }
    else if (fabs(feps - 0.15) <= 0.000001) {
        e_alpha = exp(0.430099 * (1 - feps));
    }
    else if (fabs(feps - 0.2) <= 0.000001) {
        e_alpha = exp(0.427369 * (1 - feps));
    }
    else {
        throw "feps error!";
    }
    const double approx = 1 - 1.0 / e_alpha;
    std::cout << "Approx: " << approx << std::endl;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, feps, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
//            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-FAST-END (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
            approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            std::cout << "Seed size: " << __vecSeed.size() << std::endl;
            time_t now = time(0);
            char* dt = ctime(&now);
            outfile.open("fast/" + model + "_" + graphname + "_" + std::to_string(epsilon) + "_" + std::to_string(feps)
                         + "_" + dt + ".txt");
            outfile << __tRes.get_running_time() << "," << "," << __numRRsets * 2 << "," <<
            infVldt << "," << "," << infSelf << "," << "," << __vecSeed.size() << "," <<
            approxOPIMC << "," << "," << time1 << "," << timeb << "," << time2 - timeb;
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}